

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint __thiscall
ON_SubDDisplayParameters::DisplayDensity(ON_SubDDisplayParameters *this,ON_SubD *subd)

{
  bool bVar1;
  uint local_6c;
  ON_SubDFace *local_58;
  ON_SubDFace *f;
  ON_SubDFaceIdIterator fit;
  uint absolute_display_density;
  uint display_density;
  ON_SubD *subd_local;
  ON_SubDDisplayParameters *this_local;
  
  fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._4_4_ = (uint)this->m_display_density;
  bVar1 = DisplayDensityIsAdaptive(this);
  if (bVar1) {
    local_6c = AbsoluteDisplayDensityFromSubD
                         (fit.m_subd_ref.m_subd_sp.
                          super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                          _4_4_,subd);
  }
  else {
    local_6c = fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_;
  }
  fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._0_4_ = local_6c;
  if (local_6c == 0) {
    ON_SubDFaceIdIterator::ON_SubDFaceIdIterator((ON_SubDFaceIdIterator *)&f,subd);
    local_58 = ON_SubDFaceIdIterator::FirstFace((ON_SubDFaceIdIterator *)&f);
    while (local_58 != (ON_SubDFace *)0x0) {
      if (((local_58->m_edge_count != 4) && (3 < local_58->m_edge_count)) &&
         (local_58->m_edge_count < 0xfff1)) {
        this_local._4_4_ = 1;
        bVar1 = true;
        goto LAB_008e27b0;
      }
      local_58 = ON_SubDFaceIdIterator::NextFace((ON_SubDFaceIdIterator *)&f);
    }
    bVar1 = false;
LAB_008e27b0:
    ON_SubDFaceIdIterator::~ON_SubDFaceIdIterator((ON_SubDFaceIdIterator *)&f);
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  return (uint)fit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
}

Assistant:

unsigned int ON_SubDDisplayParameters::DisplayDensity(const ON_SubD& subd) const
{
  const unsigned display_density = this->m_display_density;
  const unsigned absolute_display_density
    = this->DisplayDensityIsAdaptive() 
    ? ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubD(display_density, subd)
    : display_density
    ;

  if (0 == absolute_display_density)
  {
    // If subd has ngons with n != 4, then the display density has to be >= 1.
    ON_SubDFaceIdIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (4 != f->m_edge_count && f->m_edge_count > 3 && f->m_edge_count <= ON_SubDFace::MaximumEdgeCount)
      {
        // This face will have f->m_edge_count subd mesh fragments of density 0.
        // That's why the default quad face density must be >= 1.
        return 1u;
      }
    }
  }

  return absolute_display_density;
}